

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode Curl_cf_setup_insert_after
                   (Curl_cfilter *cf_at,Curl_easy *data,Curl_dns_entry *remotehost,int transport,
                   int ssl_mode)

{
  CURLcode CVar1;
  Curl_cfilter *pCStack_30;
  CURLcode result;
  Curl_cfilter *cf;
  int ssl_mode_local;
  int transport_local;
  Curl_dns_entry *remotehost_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_at_local;
  
  cf._0_4_ = ssl_mode;
  cf._4_4_ = transport;
  _ssl_mode_local = remotehost;
  remotehost_local = (Curl_dns_entry *)data;
  data_local = (Curl_easy *)cf_at;
  CVar1 = cf_setup_create(&stack0xffffffffffffffd0,data,remotehost,transport,ssl_mode);
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_insert_after((Curl_cfilter *)data_local,pCStack_30);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_setup_insert_after(struct Curl_cfilter *cf_at,
                                    struct Curl_easy *data,
                                    const struct Curl_dns_entry *remotehost,
                                    int transport,
                                    int ssl_mode)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  DEBUGASSERT(data);
  result = cf_setup_create(&cf, data, remotehost, transport, ssl_mode);
  if(result)
    goto out;
  Curl_conn_cf_insert_after(cf_at, cf);
out:
  return result;
}